

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3JsonTableFunctions(sqlite3 *db)

{
  uint local_18;
  int local_14;
  uint i;
  int rc;
  sqlite3 *db_local;
  
  local_14 = 0;
  for (local_18 = 0; local_18 < 2 && local_14 == 0; local_18 = local_18 + 1) {
    local_14 = sqlite3_create_module
                         (db,sqlite3JsonTableFunctions::aMod[local_18].zName,
                          sqlite3JsonTableFunctions::aMod[local_18].pModule,(void *)0x0);
  }
  return local_14;
}

Assistant:

SQLITE_PRIVATE int sqlite3JsonTableFunctions(sqlite3 *db){
  int rc = SQLITE_OK;
  static const struct {
    const char *zName;
    sqlite3_module *pModule;
  } aMod[] = {
    { "json_each",            &jsonEachModule               },
    { "json_tree",            &jsonTreeModule               },
  };
  unsigned int i;
  for(i=0; i<sizeof(aMod)/sizeof(aMod[0]) && rc==SQLITE_OK; i++){
    rc = sqlite3_create_module(db, aMod[i].zName, aMod[i].pModule, 0);
  }
  return rc;
}